

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_properties(PyObject *self,PyObject *args)

{
  long lVar1;
  int iVar2;
  PyObject *pPVar3;
  xmlAttrPtr attr;
  PyObject *obj;
  undefined *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:properties",&local_10);
  if (iVar2 != 0) {
    if (((local_10 == &_Py_NoneStruct) || (lVar1 = *(long *)(local_10 + 0x10), lVar1 == 0)) ||
       (*(int *)(lVar1 + 8) != 1)) {
      attr = (xmlAttrPtr)0x0;
    }
    else {
      attr = *(xmlAttrPtr *)(lVar1 + 0x58);
    }
    pPVar3 = libxml_xmlAttrPtrWrap(attr);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_properties(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlAttrPtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:properties", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);
    if ((cur != NULL) && (cur->type == XML_ELEMENT_NODE))
        res = cur->properties;
    else
        res = NULL;
    resultobj = libxml_xmlAttrPtrWrap(res);
    return resultobj;
}